

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  long in_RSI;
  int in_EDI;
  ofstream ofs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Tc;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  G;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A;
  packed_gamma_file3<unsigned_int,_6UL> pgf;
  packed_gamma_file3<unsigned_int,_6UL> out_file;
  string ext;
  string name;
  size_t dot;
  string out;
  string in;
  string mode;
  packed_gamma_file3<unsigned_int,_6UL> *in_stack_fffffffffffff020;
  packed_gamma_file3<unsigned_int,_6UL> *this;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *this_00;
  undefined1 local_f28 [80];
  ofstream *in_stack_fffffffffffff128;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff130;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_stack_fffffffffffff138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff288;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_stack_fffffffffffff290;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff298;
  packed_gamma_file3<unsigned_int,_6UL> *in_stack_fffffffffffff2a0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_d28 [3];
  string local_ce0 [136];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff3a8;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_stack_fffffffffffff3b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff3b8;
  packed_gamma_file3<unsigned_int,_6UL> *in_stack_fffffffffffff3c0;
  undefined1 in_stack_fffffffffffff467;
  string *in_stack_fffffffffffff468;
  packed_gamma_file3<unsigned_int,_6UL> *in_stack_fffffffffffff470;
  string local_818 [664];
  string *in_stack_fffffffffffffa80;
  string local_350 [32];
  undefined1 local_330 [520];
  string local_128 [32];
  string local_108 [32];
  long local_e8;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if ((in_EDI != 3) && (in_EDI != 4)) {
    help();
  }
  pcVar1 = *(char **)(local_10 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pcVar1 = *(char **)(local_10 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,pcVar1,&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::string(local_90);
  if (local_8 == 4) {
    pcVar1 = *(char **)(local_10 + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
    std::__cxx11::string::operator=(local_90,local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  else {
    pcVar1 = *(char **)(local_10 + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,pcVar1,&local_d9);
    std::__cxx11::string::operator=(local_90,local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    iVar3 = std::__cxx11::string::compare((char *)local_30);
    if (iVar3 == 0) {
      std::__cxx11::string::append((char *)local_90);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)local_30);
      if (iVar3 == 0) {
        local_e8 = std::__cxx11::string::find_last_of((char *)local_90,0x13d3ae);
        if (local_e8 != -1) {
          std::__cxx11::string::substr((ulong)local_108,(ulong)local_90);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_128,(ulong)local_90);
          iVar3 = std::__cxx11::string::compare((char *)local_128);
          if (iVar3 == 0) {
            std::__cxx11::string::operator=(local_90,local_108);
          }
          else {
            std::__cxx11::string::append((char *)local_90);
          }
          std::__cxx11::string::~string(local_128);
          std::__cxx11::string::~string(local_108);
        }
      }
      else {
        help();
      }
    }
  }
  std::ifstream::ifstream(local_330,local_68,_S_in);
  bVar2 = std::ios::good();
  std::ifstream::~ifstream(local_330);
  if (((bVar2 ^ 0xff) & 1) != 0) {
    help();
  }
  iVar3 = std::__cxx11::string::compare((char *)local_30);
  if (iVar3 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Compressing file ");
    poVar4 = std::operator<<(poVar4,local_68);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Output will be saved to file ");
    poVar4 = std::operator<<(poVar4,local_90);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_350,local_68);
    compute_repair(in_stack_fffffffffffffa80);
    std::__cxx11::string::~string(local_350);
    std::__cxx11::string::string(local_818,local_90);
    packed_gamma_file3<unsigned_int,_6UL>::packed_gamma_file3
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,(bool)in_stack_fffffffffffff467);
    std::__cxx11::string::~string(local_818);
    packed_gamma_file3<unsigned_int,_6UL>::compress_and_store
              (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0,
               in_stack_fffffffffffff3a8);
    packed_gamma_file3<unsigned_int,_6UL>::~packed_gamma_file3(in_stack_fffffffffffff020);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Decompressing archive ");
    poVar4 = std::operator<<(poVar4,local_68);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Output will be saved to ");
    poVar4 = std::operator<<(poVar4,local_90);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_ce0,local_68);
    packed_gamma_file3<unsigned_int,_6UL>::packed_gamma_file3
              (in_stack_fffffffffffff470,in_stack_fffffffffffff468,(bool)in_stack_fffffffffffff467);
    std::__cxx11::string::~string(local_ce0);
    this = (packed_gamma_file3<unsigned_int,_6UL> *)(local_d28 + 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x122bc1);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)0x122bd3);
    this_00 = local_d28;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x122be5);
    packed_gamma_file3<unsigned_int,_6UL>::read_and_decompress
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290,
               in_stack_fffffffffffff288);
    std::ofstream::ofstream(local_f28,local_90,_S_out);
    decompress(in_stack_fffffffffffff140,in_stack_fffffffffffff138,in_stack_fffffffffffff130,
               in_stack_fffffffffffff128);
    std::ofstream::close();
    poVar4 = std::operator<<((ostream *)&std::cout,"done.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ofstream::~ofstream(local_f28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~vector(this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    packed_gamma_file3<unsigned_int,_6UL>::~packed_gamma_file3(this);
  }
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc,char** argv) {

	if(argc!=3 and argc != 4) help();

	string mode(argv[1]);

	string in(argv[2]);
	string out;

	if(argc == 4){

		//use output name provided by user
		out = string(argv[3]);

	}else{

		out = string(argv[2]);

		if(mode.compare("c")==0){

			//if compress mode, append .rp
			out.append(".rp");

		}else if(mode.compare("d")==0){


			//if decompress mode, extract extension (if any)
			size_t dot = out.find_last_of(".");
			if (dot != std::string::npos){

				string name = out.substr(0, dot);
				string ext  = out.substr(dot, out.size() - dot);

				//if extension = .rp, remove it. Otherwise, add extension .decompressed
				if(ext.compare(".rp") == 0){

					out = name;

				}else{

					out.append(".decompressed");

				}

			}

		}else{

			help();

		}

	}

	if(not ifstream(in).good()) help();


	if(mode.compare("c")==0){

		cout << "Compressing file " << in << endl;
		cout << "Output will be saved to file " << out << endl<<endl;

		compute_repair(in);

		packed_gamma_file3<> out_file(out);
		//compress the grammar with Elias' gamma-encoding and store it to file
		out_file.compress_and_store(A,G,T_vec);

	}else{

		cout << "Decompressing archive " << in << endl;
		cout << "Output will be saved to " << out << endl;

		auto pgf = packed_gamma_file3<>(in, false);

		vector<itype> A;
		vector<pair<itype,itype> > G;
		vector<itype> Tc;

		//read and decompress grammar (the DAG)
		pgf.read_and_decompress(A,G,Tc);

		ofstream ofs(out);

		//expand the grammar to file
		decompress(A,G,Tc,ofs);

		ofs.close();

		cout << "done." << endl;

	}

}